

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<false,_false,_true>::xcheck_
          (DaTrie<false,_false,_true> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint8_t *puVar1;
  ulong uVar2;
  pointer pBVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar2 = edge->size_;
  if (uVar2 == 1) {
    uVar4 = this->head_pos_;
    if (uVar4 == 0xffffffff) {
      uVar4 = (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    return uVar4 ^ edge->labels_[0];
  }
  uVar4 = this->head_pos_;
  if (uVar4 == 0xffffffff) {
    return (uint)edge->labels_[0] ^
           (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = uVar4;
  do {
    if (uVar2 <= (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5 >> 8].num_emps) {
      uVar7 = uVar5 ^ edge->labels_[0];
      bVar8 = uVar2 == 0;
      if (uVar2 != 0) {
        if ((long)pBVar3[uVar5] < 0) {
          bVar8 = false;
        }
        else {
          uVar6 = 1;
          do {
            bVar8 = uVar2 == uVar6;
            if (bVar8) break;
            puVar1 = edge->labels_ + uVar6;
            uVar6 = uVar6 + 1;
          } while (-1 < (long)pBVar3[*puVar1 ^ uVar7]);
        }
      }
      if (bVar8) {
        return uVar7;
      }
    }
    uVar5 = *(uint *)(pBVar3 + uVar5) & 0x7fffffff;
    if (uVar5 == uVar4) {
      return (uint)edge->labels_[0] ^
             (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3);
    }
  } while( true );
}

Assistant:

size_t size() const { return size_; }